

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

void __thiscall
Bipartition::Bipartition
          (Bipartition *this,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  
  (in_RDI->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_toString_abi_cxx11__001b49b8;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15beda);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_RDI,(allocator<unsigned_long> *)in_stack_ffffffffffffff98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15bef5);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_RDI,in_stack_ffffffffffffff98);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(in_RDI);
  return;
}

Assistant:

Bipartition::Bipartition(const boost::dynamic_bitset<> &edge) {
    partition = boost::dynamic_bitset<>(edge);
}